

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

double get_noise_var_highbd
                 (uint16_t *data,uint16_t *denoised,int stride,int w,int h,int x_o,int y_o,
                 int block_size_x,int block_size_y)

{
  double dVar1;
  int local_50;
  int local_4c;
  double noise;
  int x;
  int y;
  double noise_mean;
  double noise_var;
  int max_w;
  int max_h;
  int x_o_local;
  int h_local;
  int w_local;
  int stride_local;
  uint16_t *denoised_local;
  uint16_t *data_local;
  
  if (h - y_o < block_size_y) {
    local_4c = h - y_o;
  }
  else {
    local_4c = block_size_y;
  }
  if (w - x_o < block_size_x) {
    local_50 = w - x_o;
  }
  else {
    local_50 = block_size_x;
  }
  noise_var = 0.0;
  noise_mean = 0.0;
  for (y = 0; y < local_4c; y = y + 1) {
    for (x = 0; x < local_50; x = x + 1) {
      dVar1 = (double)data[(y_o + y) * stride + x_o + x] -
              (double)denoised[(y_o + y) * stride + x_o + x];
      noise_mean = dVar1 + noise_mean;
      noise_var = dVar1 * dVar1 + noise_var;
    }
  }
  dVar1 = noise_mean / (double)(local_50 * local_4c);
  return -dVar1 * dVar1 + noise_var / (double)(local_50 * local_4c);
}

Assistant:

static inline double get_noise_var(const uint8_t *data, const uint8_t *denoised,
                                   int w, int h, int stride, int x_o, int y_o,
                                   int block_size_x, int block_size_y,
                                   int use_highbd) {
  if (use_highbd)
    return get_noise_var_highbd((const uint16_t *)data,
                                (const uint16_t *)denoised, w, h, stride, x_o,
                                y_o, block_size_x, block_size_y);
  return get_noise_var_lowbd(data, denoised, w, h, stride, x_o, y_o,
                             block_size_x, block_size_y);
}